

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandDSec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  uint local_bc;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *local_b0;
  Fra_Sec_t SecPar;
  
  local_b0 = Abc_FrameReadNtk(pAbc);
  Fra_SecSetDefaultParams(&SecPar);
  SecPar.TimeLimit = 0;
  local_bc = 0;
  Extra_UtilGetoptReset();
LAB_002006d5:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FTarmfnwvh");
    iVar2 = globalUtilOptind;
    switch(iVar1) {
    case 0x6d:
      SecPar.fRetimeRegs = SecPar.fRetimeRegs ^ 1;
      goto LAB_002006d5;
    case 0x6e:
      local_bc = local_bc ^ 1;
      goto LAB_002006d5;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x74:
    case 0x75:
      goto switchD_002006f1_caseD_6f;
    case 0x72:
      SecPar.fRetimeFirst = SecPar.fRetimeFirst ^ 1;
      goto LAB_002006d5;
    case 0x76:
      SecPar.fVerbose = SecPar.fVerbose ^ 1;
      goto LAB_002006d5;
    case 0x77:
      SecPar.fVeryVerbose = SecPar.fVeryVerbose ^ 1;
      goto LAB_002006d5;
    }
    if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_002008aa:
        Abc_Print(-1,pcVar3);
        goto switchD_002006f1_caseD_6f;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      SecPar.nFramesMax = iVar1;
    }
    else {
      if (iVar1 != 0x54) {
        if (iVar1 == 0x61) {
          SecPar.fPhaseAbstract = SecPar.fPhaseAbstract ^ 1;
        }
        else {
          if (iVar1 != 0x66) {
            if (iVar1 == -1) {
              iVar2 = Abc_NtkPrepareTwoNtks
                                (_stdout,local_b0,argv + globalUtilOptind,argc - globalUtilOptind,
                                 &pNtk1,&pNtk2,&fDelete1,&fDelete2);
              if (iVar2 == 0) {
                return 1;
              }
              if ((pNtk1->nObjCounts[8] != 0) && (pNtk2->nObjCounts[8] != 0)) {
                if (local_bc != 0) {
                  if (fDelete1 == 0) {
                    pNtk1 = Abc_NtkStrash(pNtk1,0,1,0);
                    fDelete1 = 1;
                  }
                  if (fDelete2 == 0) {
                    pNtk2 = Abc_NtkStrash(pNtk2,0,1,0);
                    fDelete2 = 1;
                  }
                  Abc_NtkShortNames(pNtk1);
                  Abc_NtkShortNames(pNtk2);
                }
                Abc_NtkDarSec(pNtk1,pNtk2,&SecPar);
                if (fDelete1 != 0) {
                  Abc_NtkDelete(pNtk1);
                }
                if (fDelete2 != 0) {
                  Abc_NtkDelete(pNtk2);
                  return 0;
                }
                return 0;
              }
              if (fDelete1 != 0) {
                Abc_NtkDelete(pNtk1);
              }
              if (fDelete2 != 0) {
                Abc_NtkDelete(pNtk2);
              }
              Abc_Print(-1,"The network has no latches. Used combinational command \"cec\".\n");
              return 0;
            }
            goto switchD_002006f1_caseD_6f;
          }
          SecPar.fFraiging = SecPar.fFraiging ^ 1;
        }
        goto LAB_002006d5;
      }
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_002008aa;
      }
      iVar1 = atoi(argv[globalUtilOptind]);
      SecPar.TimeLimit = iVar1;
    }
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_002006f1_caseD_6f:
      Abc_Print(-2,"usage: dsec [-F num] [-T num] [-armfnwvh] <file1> <file2>\n");
      Abc_Print(-2,"\t         performs inductive sequential equivalence checking\n");
      Abc_Print(-2,"\t-F num : the limit on the depth of induction [default = %d]\n",
                (ulong)(uint)SecPar.nFramesMax);
      Abc_Print(-2,"\t-T num : the approximate runtime limit (in seconds) [default = %d]\n",
                (ulong)(uint)SecPar.TimeLimit);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (SecPar.fPhaseAbstract == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-a     : toggles the use of phase abstraction [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (SecPar.fRetimeFirst == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r     : toggles forward retiming at the beginning [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (SecPar.fRetimeRegs == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-m     : toggles min-register retiming [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (SecPar.fFraiging == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-f     : toggles the internal use of fraiging [default = %s]\n",pcVar3);
      pcVar3 = "by order";
      if (local_bc == 0) {
        pcVar3 = "by name";
      }
      Abc_Print(-2,
                "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n",
                pcVar3);
      pcVar3 = "yes";
      if (SecPar.fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar3);
      if (SecPar.fVeryVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w     : toggles additional verbose output [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
      Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
      Abc_Print(-2,"\t         if one file is given, uses the current network and the file\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDSec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Fra_Sec_t SecPar, * pSecPar = &SecPar;
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fIgnoreNames;

    extern int Abc_NtkDarSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Fra_Sec_t * p );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Fra_SecSetDefaultParams( pSecPar );
    pSecPar->TimeLimit = 0;
    fIgnoreNames = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FTarmfnwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pSecPar->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pSecPar->nFramesMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pSecPar->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pSecPar->TimeLimit < 0 )
                goto usage;
            break;
        case 'a':
            pSecPar->fPhaseAbstract ^= 1;
            break;
        case 'r':
            pSecPar->fRetimeFirst ^= 1;
            break;
        case 'm':
            pSecPar->fRetimeRegs ^= 1;
            break;
        case 'f':
            pSecPar->fFraiging ^= 1;
            break;
        case 'n':
            fIgnoreNames ^= 1;
            break;
        case 'w':
            pSecPar->fVeryVerbose ^= 1;
            break;
        case 'v':
            pSecPar->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;
    if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
    {
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
        Abc_Print( -1, "The network has no latches. Used combinational command \"cec\".\n" );
        return 0;
    }

    if ( fIgnoreNames )
    {
        if ( !fDelete1 )
        {
            pNtk1 = Abc_NtkStrash( pNtk1, 0, 1, 0 );
            fDelete1 = 1;
        }
        if ( !fDelete2 )
        {
            pNtk2 = Abc_NtkStrash( pNtk2, 0, 1, 0 );
            fDelete2 = 1;
        }
        Abc_NtkShortNames( pNtk1 );
        Abc_NtkShortNames( pNtk2 );
    }

    // perform verification
    Abc_NtkDarSec( pNtk1, pNtk2, pSecPar );

    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    Abc_Print( -2, "usage: dsec [-F num] [-T num] [-armfnwvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs inductive sequential equivalence checking\n" );
    Abc_Print( -2, "\t-F num : the limit on the depth of induction [default = %d]\n", pSecPar->nFramesMax );
    Abc_Print( -2, "\t-T num : the approximate runtime limit (in seconds) [default = %d]\n", pSecPar->TimeLimit );
    Abc_Print( -2, "\t-a     : toggles the use of phase abstraction [default = %s]\n", pSecPar->fPhaseAbstract? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggles forward retiming at the beginning [default = %s]\n", pSecPar->fRetimeFirst? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles min-register retiming [default = %s]\n", pSecPar->fRetimeRegs? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggles the internal use of fraiging [default = %s]\n", pSecPar->fFraiging? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n", fIgnoreNames? "by order": "by name" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", pSecPar->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggles additional verbose output [default = %s]\n", pSecPar->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}